

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_edge.c
# Opt level: O1

REF_STATUS ref_edge_ghost_int(REF_EDGE ref_edge,REF_MPI ref_mpi,REF_INT *data)

{
  int iVar1;
  bool bVar2;
  void *__ptr;
  REF_STATUS RVar3;
  uint uVar4;
  uint uVar5;
  REF_INT *pRVar6;
  long lVar7;
  void *pvVar8;
  ulong uVar9;
  int iVar10;
  ulong uVar11;
  long lVar12;
  undefined8 uVar13;
  size_t sVar14;
  REF_INT *recv_size;
  char *pcVar15;
  int iVar16;
  REF_MPI ref_mpi_00;
  uint uVar17;
  long lVar18;
  REF_INT node1;
  REF_INT node0;
  int local_a4;
  REF_INT *local_a0;
  int local_94;
  REF_NODE local_90;
  REF_MPI local_88;
  REF_INT *local_80;
  long local_78;
  void *local_70;
  void *local_68;
  REF_INT local_5c;
  REF_INT local_58;
  REF_INT local_54;
  int *local_50;
  void *local_48;
  void *local_40;
  REF_INT *local_38;
  
  if ((long)ref_mpi->n < 2) {
    return 0;
  }
  local_90 = ref_edge->node;
  sVar14 = (long)ref_mpi->n << 2;
  local_88 = ref_mpi;
  pRVar6 = (REF_INT *)malloc(sVar14);
  if (pRVar6 == (REF_INT *)0x0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_edge.c",0xb9,
           "ref_edge_ghost_int","malloc a_size of REF_INT NULL");
    return 2;
  }
  memset(pRVar6,0,sVar14);
  ref_mpi_00 = local_88;
  iVar10 = local_88->n;
  recv_size = (REF_INT *)(long)iVar10;
  local_a0 = pRVar6;
  local_38 = data;
  if ((long)recv_size < 0) {
    bVar2 = false;
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_edge.c",0xba,
           "ref_edge_ghost_int","malloc b_size of REF_INT negative");
    RVar3 = 1;
  }
  else {
    sVar14 = (long)recv_size * 4;
    recv_size = (REF_INT *)malloc(sVar14);
    if (recv_size == (REF_INT *)0x0) {
      bVar2 = false;
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_edge.c",0xba,
             "ref_edge_ghost_int","malloc b_size of REF_INT NULL");
      recv_size = (REF_INT *)0x0;
    }
    else {
      RVar3 = 2;
      bVar2 = true;
      pRVar6 = local_a0;
      if (iVar10 == 0) goto LAB_001e57ab;
      memset(recv_size,0,sVar14);
      bVar2 = true;
    }
    RVar3 = 2;
    pRVar6 = local_a0;
  }
LAB_001e57ab:
  if (!bVar2) {
    return RVar3;
  }
  local_78 = CONCAT44(local_78._4_4_,RVar3);
  iVar10 = ref_edge->n;
  if (iVar10 < 1) {
    iVar10 = 0;
  }
  else {
    iVar1 = ref_mpi_00->id;
    iVar16 = 0;
    local_80 = recv_size;
    do {
      ref_edge_part(ref_edge,iVar16,&local_a4);
      if (local_a4 != iVar1) {
        local_a0[local_a4] = local_a0[local_a4] + 1;
      }
      iVar16 = iVar16 + 1;
      recv_size = local_80;
      ref_mpi_00 = local_88;
      pRVar6 = local_a0;
    } while (iVar10 != iVar16);
  }
  local_94 = iVar10;
  uVar4 = ref_mpi_alltoall(ref_mpi_00,pRVar6,recv_size,1);
  if (uVar4 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_edge.c",0xc2,
           "ref_edge_ghost_int",(ulong)uVar4,"alltoall sizes");
    return uVar4;
  }
  iVar10 = local_88->n;
  lVar18 = (long)iVar10;
  if (lVar18 < 1) {
    uVar4 = 0;
    local_a4 = 0;
  }
  else {
    lVar7 = 0;
    uVar4 = 0;
    do {
      uVar4 = uVar4 + pRVar6[lVar7];
      lVar7 = lVar7 + 1;
      local_a4 = iVar10;
    } while (lVar18 != lVar7);
  }
  if ((int)uVar4 < 0) {
    pcVar15 = "malloc a_nodes of REF_GLOB negative";
    uVar13 = 0xc6;
    goto LAB_001e592f;
  }
  pRVar6 = (REF_INT *)malloc((ulong)(uVar4 * 2) << 3);
  if (pRVar6 == (REF_INT *)0x0) {
    pcVar15 = "malloc a_nodes of REF_GLOB NULL";
    uVar13 = 0xc6;
  }
  else {
    local_80 = pRVar6;
    pvVar8 = malloc((ulong)uVar4 << 2);
    if (pvVar8 == (void *)0x0) {
      pcVar15 = "malloc a_data of REF_INT NULL";
      uVar13 = 199;
    }
    else {
      local_40 = pvVar8;
      pvVar8 = malloc((ulong)uVar4 << 2);
      if (pvVar8 == (void *)0x0) {
        pcVar15 = "malloc a_edge of REF_INT NULL";
        uVar13 = 200;
      }
      else {
        if (iVar10 < 1) {
          uVar17 = 0;
          local_a4 = 0;
        }
        else {
          lVar7 = 0;
          uVar17 = 0;
          do {
            uVar17 = uVar17 + recv_size[lVar7];
            lVar7 = lVar7 + 1;
            local_a4 = iVar10;
          } while (lVar18 != lVar7);
        }
        if ((int)uVar17 < 0) {
          pcVar15 = "malloc b_nodes of REF_GLOB negative";
          uVar13 = 0xcc;
LAB_001e592f:
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_edge.c",
                 uVar13,"ref_edge_ghost_int",pcVar15);
          return 1;
        }
        local_48 = pvVar8;
        local_70 = malloc((ulong)(uVar17 * 2) << 3);
        if (local_70 == (void *)0x0) {
          pcVar15 = "malloc b_nodes of REF_GLOB NULL";
          uVar13 = 0xcc;
        }
        else {
          pvVar8 = malloc((ulong)uVar17 << 2);
          if (pvVar8 == (void *)0x0) {
            pcVar15 = "malloc b_data of REF_INT NULL";
            uVar13 = 0xcd;
          }
          else {
            if (iVar10 < 0) {
              pcVar15 = "malloc a_next of REF_INT negative";
              uVar13 = 0xcf;
              goto LAB_001e592f;
            }
            local_68 = pvVar8;
            local_50 = (int *)malloc(lVar18 * 4);
            if (local_50 != (int *)0x0) {
              *local_50 = 0;
              lVar7 = 1;
              if (1 < iVar10) {
                iVar10 = *local_50;
                lVar7 = 1;
                do {
                  iVar10 = iVar10 + local_a0[lVar7 + -1];
                  local_50[lVar7] = iVar10;
                  lVar7 = lVar7 + 1;
                } while (lVar18 != lVar7);
              }
              local_a4 = (int)lVar7;
              iVar10 = ref_edge->n;
              if ((long)iVar10 < 1) {
                lVar18 = 0;
              }
              else {
                local_5c = local_88->id;
                lVar18 = 0;
                do {
                  ref_edge_part(ref_edge,(REF_INT)lVar18,&local_a4);
                  if (local_a4 != local_5c) {
                    iVar1 = local_50[local_a4];
                    *(REF_INT *)((long)local_48 + (long)iVar1 * 4) = (REF_INT)lVar18;
                    pRVar6 = ref_edge->e2n;
                    iVar16 = pRVar6[lVar18 * 2];
                    lVar12 = -1;
                    lVar7 = -1;
                    if (((-1 < (long)iVar16) && (iVar16 < local_90->max)) &&
                       (lVar7 = local_90->global[iVar16], lVar7 < 0)) {
                      lVar7 = -1;
                    }
                    *(long *)(local_80 + (long)iVar1 * 4) = lVar7;
                    iVar16 = pRVar6[lVar18 * 2 + 1];
                    if (((-1 < (long)iVar16) && (iVar16 < local_90->max)) &&
                       (lVar12 = local_90->global[iVar16], lVar12 < 0)) {
                      lVar12 = -1;
                    }
                    *(long *)(local_80 + (long)(int)(iVar1 * 2 | 1) * 2) = lVar12;
                    local_50[local_a4] = iVar1 + 1;
                  }
                  lVar18 = lVar18 + 1;
                } while (iVar10 != lVar18);
              }
              local_94 = (int)lVar18;
              uVar5 = ref_mpi_alltoallv(local_88,local_80,local_a0,local_70,recv_size,2,2);
              if (uVar5 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_edge.c"
                       ,0xe2,"ref_edge_ghost_int",(ulong)uVar5,"alltoallv requested nodes");
                return uVar5;
              }
              if (uVar17 != 0) {
                uVar9 = 1;
                if (1 < (int)uVar17) {
                  uVar9 = (ulong)uVar17;
                }
                local_78 = uVar9 << 2;
                lVar18 = 0;
                do {
                  uVar17 = ref_node_local(local_90,*(REF_GLOB *)((long)local_70 + lVar18 * 4),
                                          &local_54);
                  if (uVar17 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_edge.c"
                           ,0xe5,"ref_edge_ghost_int",(ulong)uVar17,"loc 0");
                    return uVar17;
                  }
                  uVar17 = ref_node_local(local_90,*(REF_GLOB *)((long)local_70 + lVar18 * 4 + 8),
                                          &local_58);
                  if (uVar17 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_edge.c"
                           ,0xe6,"ref_edge_ghost_int",(ulong)uVar17,"loc 1");
                    return uVar17;
                  }
                  uVar17 = ref_edge_with(ref_edge,local_54,local_58,&local_94);
                  if (uVar17 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_edge.c"
                           ,0xe7,"ref_edge_ghost_int",(ulong)uVar17,"find edge");
                    return uVar17;
                  }
                  *(REF_INT *)((long)local_68 + lVar18) = local_38[local_94];
                  lVar18 = lVar18 + 4;
                } while (local_78 != lVar18);
              }
              uVar17 = ref_mpi_alltoallv(local_88,local_68,recv_size,local_40,local_a0,1,1);
              __ptr = local_40;
              pvVar8 = local_48;
              if (uVar17 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_edge.c"
                       ,0xed,"ref_edge_ghost_int",(ulong)uVar17,"alltoallv return data");
                return uVar17;
              }
              if (uVar4 != 0) {
                uVar9 = 1;
                if (1 < (int)uVar4) {
                  uVar9 = (ulong)uVar4;
                }
                uVar11 = 0;
                do {
                  local_38[*(int *)((long)local_48 + uVar11 * 4)] =
                       *(REF_INT *)((long)local_40 + uVar11 * 4);
                  uVar11 = uVar11 + 1;
                } while (uVar9 != uVar11);
              }
              free(local_50);
              free(local_68);
              free(local_70);
              free(pvVar8);
              free(__ptr);
              free(local_80);
              if (recv_size != (REF_INT *)0x0) {
                free(recv_size);
              }
              if (local_a0 != (REF_INT *)0x0) {
                free(local_a0);
                return 0;
              }
              return 0;
            }
            pcVar15 = "malloc a_next of REF_INT NULL";
            uVar13 = 0xcf;
          }
        }
      }
    }
  }
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_edge.c",uVar13,
         "ref_edge_ghost_int",pcVar15);
  return 2;
}

Assistant:

REF_FCN REF_STATUS ref_edge_ghost_int(REF_EDGE ref_edge, REF_MPI ref_mpi,
                                      REF_INT *data) {
  REF_NODE ref_node = ref_edge_node(ref_edge);
  REF_INT *a_size, *b_size;
  REF_INT a_total, b_total;
  REF_INT edge;
  REF_INT part;
  REF_INT *a_next, *a_edge;
  REF_GLOB *a_nodes, *b_nodes;
  REF_INT *a_data, *b_data;

  REF_INT node0, node1;
  REF_INT request;

  if (!ref_mpi_para(ref_mpi)) return REF_SUCCESS;

  ref_malloc_init(a_size, ref_mpi_n(ref_mpi), REF_INT, 0);
  ref_malloc_init(b_size, ref_mpi_n(ref_mpi), REF_INT, 0);

  for (edge = 0; edge < ref_edge_n(ref_edge); edge++) {
    RSS(ref_edge_part(ref_edge, edge, &part), "edge part");
    if (part != ref_mpi_rank(ref_mpi)) a_size[part]++;
  }

  RSS(ref_mpi_alltoall(ref_mpi, a_size, b_size, REF_INT_TYPE),
      "alltoall sizes");

  a_total = 0;
  each_ref_mpi_part(ref_mpi, part) a_total += a_size[part];
  ref_malloc(a_nodes, 2 * a_total, REF_GLOB);
  ref_malloc(a_data, a_total, REF_INT);
  ref_malloc(a_edge, a_total, REF_INT);

  b_total = 0;
  each_ref_mpi_part(ref_mpi, part) b_total += b_size[part];
  ref_malloc(b_nodes, 2 * b_total, REF_GLOB);
  ref_malloc(b_data, b_total, REF_INT);

  ref_malloc(a_next, ref_mpi_n(ref_mpi), REF_INT);
  a_next[0] = 0;
  each_ref_mpi_worker(ref_mpi, part) a_next[part] =
      a_next[part - 1] + a_size[part - 1];

  for (edge = 0; edge < ref_edge_n(ref_edge); edge++) {
    RSS(ref_edge_part(ref_edge, edge, &part), "edge part");
    if (part != ref_mpi_rank(ref_mpi)) {
      a_edge[a_next[part]] = edge;
      a_nodes[0 + 2 * a_next[part]] =
          ref_node_global(ref_node, ref_edge_e2n(ref_edge, 0, edge));
      a_nodes[1 + 2 * a_next[part]] =
          ref_node_global(ref_node, ref_edge_e2n(ref_edge, 1, edge));
      (a_next[part])++;
    }
  }

  RSS(ref_mpi_alltoallv(ref_mpi, a_nodes, a_size, b_nodes, b_size, 2,
                        REF_GLOB_TYPE),
      "alltoallv requested nodes");

  for (request = 0; request < b_total; request++) {
    RSS(ref_node_local(ref_node, b_nodes[0 + 2 * request], &node0), "loc 0");
    RSS(ref_node_local(ref_node, b_nodes[1 + 2 * request], &node1), "loc 1");
    RSS(ref_edge_with(ref_edge, node0, node1, &edge), "find edge");
    b_data[request] = data[edge];
  }

  RSS(ref_mpi_alltoallv(ref_mpi, b_data, b_size, a_data, a_size, 1,
                        REF_INT_TYPE),
      "alltoallv return data");

  for (request = 0; request < a_total; request++) {
    data[a_edge[request]] = a_data[request];
  }

  ref_free(a_next);

  ref_free(b_data);
  ref_free(b_nodes);

  ref_free(a_edge);

  ref_free(a_data);
  ref_free(a_nodes);

  ref_free(b_size);
  ref_free(a_size);

  return REF_SUCCESS;
}